

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  char cVar1;
  zip *zip_00;
  int iVar2;
  wchar_t wVar3;
  int64_t iVar4;
  void *pvVar5;
  int64_t local_58;
  wchar_t local_4c;
  wchar_t ret_zip64;
  wchar_t ret;
  wchar_t tail;
  wchar_t i;
  char *p;
  int64_t current_offset;
  int64_t file_size;
  zip *zip;
  wchar_t best_bid_local;
  archive_read *a_local;
  
  zip_00 = (zip *)a->format->data;
  if (best_bid < L'!') {
    local_58 = __archive_read_seek(a,0,2);
    if (local_58 < 1) {
      a_local._4_4_ = L'\0';
    }
    else {
      if (0x4000 < local_58) {
        local_58 = 0x4000;
      }
      iVar2 = (int)local_58;
      iVar4 = __archive_read_seek(a,(long)-iVar2,2);
      if (iVar4 < 0) {
        a_local._4_4_ = L'\0';
      }
      else {
        pvVar5 = __archive_read_ahead(a,(long)iVar2,(ssize_t *)0x0);
        if (pvVar5 == (void *)0x0) {
          a_local._4_4_ = L'\0';
        }
        else {
          ret = iVar2 + L'\xffffffea';
          while (L'\0' < ret) {
            cVar1 = *(char *)((long)pvVar5 + (long)ret);
            if (cVar1 == '\x05') {
              ret = ret + L'\xfffffffe';
            }
            else if (cVar1 == '\x06') {
              ret = ret + L'\xfffffffd';
            }
            else if (cVar1 == 'K') {
              ret = ret + L'\xffffffff';
            }
            else if (cVar1 == 'P') {
              if (*(int *)((long)pvVar5 + (long)ret) == 0x6054b50) {
                local_4c = read_eocd(zip_00,(char *)((long)pvVar5 + (long)ret),iVar4 + ret);
                if (((L'\x13' < ret) && (*(int *)((long)pvVar5 + (long)ret + -0x14) == 0x7064b50))
                   && (wVar3 = read_zip64_eocd(a,zip_00,(char *)((long)pvVar5 + (long)ret + -0x14)),
                      local_4c < wVar3)) {
                  local_4c = wVar3;
                }
                return local_4c;
              }
              ret = ret + L'\xfffffffc';
            }
            else {
              ret = ret + L'\xfffffffc';
            }
          }
          a_local._4_4_ = L'\0';
        }
      }
    }
  }
  else {
    a_local._4_4_ = L'\xffffffff';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) */
	tail = (int)zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* Boyer-Moore search backwards from the end, since we want
	 * to match the last EOCD in the file (there can be more than
	 * one if there is an uncompressed Zip archive as a member
	 * within this Zip archive). */
	for (i = tail - 22; i > 0;) {
		switch (p[i]) {
		case 'P':
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i,
				    current_offset + i);
				/* Zip64 EOCD locator precedes
				 * regular EOCD if present. */
				if (i >= 20 && memcmp(p + i - 20, "PK\006\007", 4) == 0) {
					int ret_zip64 = read_zip64_eocd(a, zip, p + i - 20);
					if (ret_zip64 > ret)
						ret = ret_zip64;
				}
				return (ret);
			}
			i -= 4;
			break;
		case 'K': i -= 1; break;
		case 005: i -= 2; break;
		case 006: i -= 3; break;
		default: i -= 4; break;
		}
	}
	return 0;
}